

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-vocab.cpp
# Opt level: O3

void __thiscall
llm_tokenizer_spm_session::resegment
          (llm_tokenizer_spm_session *this,llm_symbol *symbol,
          vector<int,_std::allocator<int>_> *output)

{
  iterator iVar1;
  iterator iVar2;
  long lVar3;
  llama_token id;
  llama_token token;
  string text;
  llama_token local_58;
  llama_token local_54;
  string local_50;
  
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,symbol->text,symbol->text + symbol->n);
  local_54 = llama_vocab::text_to_token(this->vocab,&local_50);
  if (local_54 == -1) {
    iVar2 = llama_vocab::std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_int>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_int>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_int>_>_>_>
            ::find(&(this->rev_merge)._M_t,&local_50);
    if ((_Rb_tree_header *)iVar2._M_node == &(this->rev_merge)._M_t._M_impl.super__Rb_tree_header) {
      llama_vocab::std::vector<int,_std::allocator<int>_>::reserve
                (output,((long)(output->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                               super__Vector_impl_data._M_finish -
                         (long)(output->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                               super__Vector_impl_data._M_start >> 2) + symbol->n);
      if (0 < (int)symbol->n) {
        lVar3 = 0;
        do {
          local_58 = llama_vocab::byte_to_token(this->vocab,symbol->text[lVar3]);
          iVar1._M_current =
               (output->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar1._M_current ==
              (output->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                      ((vector<int,std::allocator<int>> *)output,iVar1,&local_58);
          }
          else {
            *iVar1._M_current = local_58;
            (output->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
            _M_finish = iVar1._M_current + 1;
          }
          lVar3 = lVar3 + 1;
        } while (lVar3 < (int)symbol->n);
      }
    }
    else {
      resegment(this,(this->symbols).super__Vector_base<llm_symbol,_std::allocator<llm_symbol>_>.
                     _M_impl.super__Vector_impl_data._M_start + (int)iVar2._M_node[2]._M_color,
                output);
      resegment(this,(this->symbols).super__Vector_base<llm_symbol,_std::allocator<llm_symbol>_>.
                     _M_impl.super__Vector_impl_data._M_start + *(int *)&iVar2._M_node[2].field_0x4,
                output);
    }
  }
  else {
    iVar1._M_current =
         (output->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
         _M_finish;
    if (iVar1._M_current ==
        (output->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
        _M_end_of_storage) {
      std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                ((vector<int,std::allocator<int>> *)output,iVar1,&local_54);
    }
    else {
      *iVar1._M_current = local_54;
      (output->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_finish = iVar1._M_current + 1;
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void resegment(llm_symbol & symbol, std::vector<llama_token> & output) {
        auto text = std::string(symbol.text, symbol.n);
        auto token = vocab.text_to_token(text);

        // Do we need to support is_unused?
        if (token != LLAMA_TOKEN_NULL) {
            output.push_back(token);
            return;
        }

        const auto p = rev_merge.find(text);

        if (p == rev_merge.end()) {
            // output any symbols that did not form tokens as bytes.
            output.reserve(output.size() + symbol.n);
            for (int j = 0; j < (int)symbol.n; ++j) {
                llama_token id = vocab.byte_to_token(symbol.text[j]);
                output.push_back(id);
            }
            return;
        }

        resegment(symbols[p->second.first], output);
        resegment(symbols[p->second.second], output);
    }